

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O2

_Bool Curl_altsvc_lookup(altsvcinfo *asi,alpnid srcalpnid,char *srchost,int srcport,
                        altsvc **dstentry,int versions)

{
  _Bool _Var1;
  time_t tVar2;
  Curl_llist_node *pCVar3;
  altsvc *as;
  Curl_llist_node *n;
  
  tVar2 = time((time_t *)0x0);
  pCVar3 = Curl_llist_head(&asi->list);
  do {
    do {
      while( true ) {
        n = pCVar3;
        if (n == (Curl_llist_node *)0x0) goto LAB_001116c6;
        as = (altsvc *)Curl_node_elem(n);
        pCVar3 = Curl_node_next(n);
        if (tVar2 <= as->expires) break;
        Curl_node_remove(n);
        altsvc_free(as);
      }
    } while ((as->src).alpnid != srcalpnid);
    _Var1 = hostcompare(srchost,(as->src).host);
  } while (((!_Var1) || ((uint)(as->src).port != srcport)) ||
          (((as->dst).alpnid & versions) == ALPN_none));
  *dstentry = as;
LAB_001116c6:
  return n != (Curl_llist_node *)0x0;
}

Assistant:

bool Curl_altsvc_lookup(struct altsvcinfo *asi,
                        enum alpnid srcalpnid, const char *srchost,
                        int srcport,
                        struct altsvc **dstentry,
                        const int versions) /* one or more bits */
{
  struct Curl_llist_node *e;
  struct Curl_llist_node *n;
  time_t now = time(NULL);
  DEBUGASSERT(asi);
  DEBUGASSERT(srchost);
  DEBUGASSERT(dstentry);

  for(e = Curl_llist_head(&asi->list); e; e = n) {
    struct altsvc *as = Curl_node_elem(e);
    n = Curl_node_next(e);
    if(as->expires < now) {
      /* an expired entry, remove */
      Curl_node_remove(e);
      altsvc_free(as);
      continue;
    }
    if((as->src.alpnid == srcalpnid) &&
       hostcompare(srchost, as->src.host) &&
       (as->src.port == srcport) &&
       (versions & (int)as->dst.alpnid)) {
      /* match */
      *dstentry = as;
      return TRUE;
    }
  }
  return FALSE;
}